

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float4x4 * ConvexDecomposition::Inverse(float4x4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int j;
  long lVar9;
  float4x4 *in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float src [16];
  
  (in_RDI->x).x = 0.0;
  (in_RDI->x).y = 0.0;
  (in_RDI->x).z = 0.0;
  (in_RDI->x).w = 0.0;
  (in_RDI->y).x = 0.0;
  (in_RDI->y).y = 0.0;
  (in_RDI->y).z = 0.0;
  (in_RDI->y).w = 0.0;
  (in_RDI->z).x = 0.0;
  (in_RDI->z).y = 0.0;
  (in_RDI->z).z = 0.0;
  (in_RDI->z).w = 0.0;
  (in_RDI->w).x = 0.0;
  (in_RDI->w).y = 0.0;
  (in_RDI->w).z = 0.0;
  (in_RDI->w).w = 0.0;
  lVar9 = 0;
  do {
    *(float *)((long)src + lVar9) = (&(m->x).x)[lVar9];
    *(float *)((long)src + lVar9 + 0x10) = (&(m->x).y)[lVar9];
    *(float *)((long)src + lVar9 + 0x20) = (&(m->x).z)[lVar9];
    *(float *)((long)src + lVar9 + 0x30) = (&(m->x).w)[lVar9];
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x10);
  auVar18 = ZEXT416((uint)src[2]);
  auVar10 = vmulss_avx512f(ZEXT416((uint)src[7]),auVar18);
  auVar17 = ZEXT416((uint)src[3]);
  auVar11 = vmulss_avx512f(ZEXT416((uint)src[6]),auVar17);
  auVar12 = vmulss_avx512f(ZEXT416((uint)src[7]),ZEXT416((uint)src[1]));
  auVar13 = vmulss_avx512f(ZEXT416((uint)src[5]),auVar17);
  auVar14 = vmulss_avx512f(ZEXT416((uint)src[6]),ZEXT416((uint)src[1]));
  auVar15 = vmulss_avx512f(ZEXT416((uint)src[5]),auVar18);
  auVar36 = ZEXT416((uint)src[7]);
  auVar16 = vmulss_avx512f(auVar36,ZEXT416((uint)src[0]));
  auVar17 = vmulss_avx512f(ZEXT416((uint)src[4]),auVar17);
  auVar18 = vmulss_avx512f(ZEXT416((uint)src[4]),auVar18);
  auVar38 = ZEXT416((uint)src[1]);
  auVar42 = ZEXT416((uint)src[4]);
  auVar19 = vmulss_avx512f(auVar42,auVar38);
  auVar20 = vmulss_avx512f(ZEXT416((uint)src[0xe]),auVar13);
  auVar20 = vfmadd231ss_avx512f(auVar20,auVar10,ZEXT416((uint)src[0xd]));
  auVar21 = vmulss_avx512f(ZEXT416((uint)src[0xe]),auVar12);
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar11,ZEXT416((uint)src[0xd]));
  auVar33 = ZEXT416((uint)src[0xe]);
  auVar22 = vmulss_avx512f(auVar33,auVar16);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar11,ZEXT416((uint)src[0xc]));
  auVar23 = vmulss_avx512f(auVar33,auVar17);
  auVar23 = vfmadd231ss_avx512f(auVar23,auVar10,ZEXT416((uint)src[0xc]));
  auVar34 = ZEXT416((uint)src[0xd]);
  auVar24 = vmulss_avx512f(auVar34,auVar16);
  auVar35 = ZEXT416((uint)src[0xc]);
  auVar24 = vfmadd231ss_avx512f(auVar24,auVar13,auVar35);
  auVar25 = vmulss_avx512f(ZEXT416((uint)src[0xb]),auVar15);
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar12,ZEXT416((uint)src[10]));
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar11,ZEXT416((uint)src[9]));
  auVar26 = vmulss_avx512f(ZEXT416((uint)src[0xb]),auVar18);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar16,ZEXT416((uint)src[10]));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)src[8]),auVar11);
  auVar30 = ZEXT416((uint)src[0xb]);
  auVar11 = vmulss_avx512f(auVar30,auVar19);
  auVar11 = vfmadd231ss_avx512f(auVar11,ZEXT416((uint)src[9]),auVar16);
  auVar32 = ZEXT416((uint)src[9]);
  auVar16 = vmulss_avx512f(auVar32,auVar10);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar14,auVar30);
  auVar37 = ZEXT416((uint)src[10]);
  auVar27 = vfmadd231ss_avx512f(auVar16,auVar13,auVar37);
  auVar28 = vfmadd231ss_avx512f(auVar11,ZEXT416((uint)src[8]),auVar13);
  auVar11 = vmulss_avx512f(auVar34,auVar17);
  auVar11 = vfmadd231ss_avx512f(auVar11,auVar12,auVar35);
  auVar16 = ZEXT416((uint)src[8]);
  auVar10 = vmulss_avx512f(auVar16,auVar10);
  auVar40 = ZEXT416((uint)src[6]);
  auVar13 = vmulss_avx512f(auVar40,ZEXT416((uint)src[0]));
  auVar10 = vfmadd231ss_avx512f(auVar10,auVar13,auVar30);
  auVar29 = vfmadd231ss_avx512f(auVar10,auVar17,auVar37);
  auVar10 = vmulss_avx512f(auVar16,auVar12);
  auVar39 = ZEXT416((uint)src[0]);
  auVar41 = ZEXT416((uint)src[5]);
  auVar12 = vmulss_avx512f(auVar41,auVar39);
  auVar10 = vfmadd231ss_avx512f(auVar10,auVar12,auVar30);
  auVar17 = vfmadd231ss_avx512f(auVar10,auVar32,auVar17);
  auVar20 = vfmadd231ss_avx512f(auVar20,auVar14,ZEXT416((uint)src[0xf]));
  auVar30 = vfmadd231ss_avx512f(auVar11,auVar12,ZEXT416((uint)src[0xf]));
  auVar10 = vmulss_avx512f(auVar34,auVar18);
  auVar10 = vfmadd231ss_avx512f(auVar10,auVar14,auVar35);
  auVar31 = vfmadd231ss_avx512f(auVar10,auVar12,auVar33);
  auVar10 = vmulss_avx512f(auVar16,auVar14);
  auVar10 = vfmadd231ss_avx512f(auVar10,auVar37,auVar12);
  auVar12 = ZEXT416((uint)src[0xf]);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar18,auVar12);
  auVar18 = vfmadd231ss_avx512f(auVar10,auVar32,auVar18);
  auVar10 = vfmadd231ss_fma(auVar23,auVar13,auVar12);
  auVar23 = vfmadd231ss_avx512f(auVar24,auVar19,auVar12);
  auVar11 = vmulss_avx512f(auVar34,auVar13);
  auVar11 = vfmadd231ss_avx512f(auVar11,auVar15,auVar35);
  auVar24 = vfmadd231ss_avx512f(auVar11,auVar19,auVar33);
  auVar11 = vmulss_avx512f(auVar37,auVar19);
  auVar11 = vfmadd231ss_avx512f(auVar11,auVar13,auVar32);
  auVar19 = vfmadd231ss_avx512f(auVar21,auVar15,auVar12);
  auVar21 = vfmadd231ss_avx512f(auVar11,auVar15,auVar16);
  auVar13 = ZEXT416((uint)src[10]);
  auVar11 = vmulss_avx512f(auVar13,ZEXT416((uint)src[0xf]));
  fVar1 = src[0xf] * src[9];
  fVar2 = src[8] * src[0xf];
  auVar12 = vmulss_avx512f(ZEXT416((uint)src[0xb]),ZEXT416((uint)src[0xe]));
  fVar3 = src[0xe] * src[9];
  fVar4 = src[8] * src[0xe];
  fVar5 = src[0xd] * src[8];
  fVar6 = src[0xb] * src[0xd];
  auVar14 = vmulss_avx512f(auVar13,ZEXT416((uint)src[0xd]));
  fVar7 = src[0xb] * src[0xc];
  auVar32 = vmulss_avx512f(auVar13,ZEXT416((uint)src[0xc]));
  fVar8 = src[0xc] * src[9];
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar6),auVar40);
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar11,auVar41);
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar3),auVar36);
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar1),auVar40);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar12,auVar41);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar14,auVar36);
  auVar15 = vsubss_avx512f(auVar13,auVar15);
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)src[6]));
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar12,auVar42);
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar32,auVar36);
  auVar16 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)src[6]));
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar11,auVar42);
  auVar34 = ZEXT416((uint)src[7]);
  auVar16 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)fVar4),auVar34);
  auVar16 = vsubss_avx512f(auVar13,auVar16);
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar7),auVar41);
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar1),auVar42);
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar5),auVar34);
  auVar33 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar41);
  auVar35 = ZEXT416((uint)src[4]);
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar6),auVar35);
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar8),auVar34);
  auVar33 = vsubss_avx512f(auVar13,auVar33);
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar4),auVar41);
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar14,auVar35);
  auVar34 = vmulss_avx512f(auVar32,auVar41);
  auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar3),auVar35);
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar8),auVar40);
  auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)fVar5),auVar40);
  auVar34 = vsubss_avx512f(auVar13,auVar34);
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)src[2]));
  auVar35 = vfmadd231ss_avx512f(auVar13,auVar11,auVar38);
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)src[2]));
  auVar36 = vfmadd231ss_avx512f(auVar13,auVar39,auVar11);
  auVar13 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * src[2])),auVar12,auVar38);
  auVar37 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar2 * src[2])),auVar39,auVar12);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(src[1] * fVar2)),auVar39,ZEXT416((uint)fVar6));
  auVar39 = ZEXT416((uint)src[0]);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * src[1])),auVar39,ZEXT416((uint)fVar1));
  auVar13 = vfmadd231ss_fma(auVar13,auVar14,ZEXT416((uint)src[3]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(src[1] * fVar4)),auVar39,auVar14);
  (in_RDI->x).x = auVar15._0_4_;
  (in_RDI->x).y = auVar16._0_4_;
  auVar16 = vmulss_avx512f(auVar16,auVar38);
  auVar15 = vfmadd231ss_fma(auVar16,auVar39,auVar15);
  auVar16 = vmulss_avx512f(auVar32,ZEXT416((uint)src[1]));
  auVar16 = vfmadd231ss_fma(auVar16,auVar39,ZEXT416((uint)fVar3));
  auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)fVar3),ZEXT416((uint)src[3]));
  auVar38 = ZEXT416((uint)src[3]);
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar4),auVar38);
  auVar32 = vfmadd231ss_avx512f(auVar37,auVar32,auVar38);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar8),auVar38);
  auVar37 = ZEXT416((uint)src[2]);
  auVar14 = vfmadd231ss_fma(auVar14,auVar37,ZEXT416((uint)fVar8));
  (in_RDI->x).z = auVar33._0_4_;
  auVar33 = vfmadd231ss_avx512f(auVar15,auVar37,auVar33);
  auVar15 = vfmadd231ss_fma(auVar16,auVar37,ZEXT416((uint)fVar5));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar5),auVar38);
  auVar16 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)src[3]),auVar34);
  (in_RDI->x).w = auVar34._0_4_;
  auVar13 = vsubss_avx512f(auVar13,auVar35);
  (in_RDI->y).x = auVar13._0_4_;
  auVar13 = vsubss_avx512f(auVar36,auVar32);
  (in_RDI->y).y = auVar13._0_4_;
  (in_RDI->y).z = auVar11._0_4_ - auVar12._0_4_;
  (in_RDI->y).w = auVar15._0_4_ - auVar14._0_4_;
  (in_RDI->z).x = auVar20._0_4_ - auVar19._0_4_;
  (in_RDI->z).y = auVar22._0_4_ - auVar10._0_4_;
  auVar10 = vsubss_avx512f(auVar30,ZEXT416(auVar23._0_4_));
  (in_RDI->z).z = auVar10._0_4_;
  auVar10 = vsubss_avx512f(auVar24,auVar31);
  (in_RDI->z).w = auVar10._0_4_;
  auVar10 = vsubss_avx512f(ZEXT416(auVar25._0_4_),auVar27);
  (in_RDI->w).x = auVar10._0_4_;
  auVar10 = vsubss_avx512f(auVar29,ZEXT416(auVar26._0_4_));
  (in_RDI->w).y = auVar10._0_4_;
  auVar10 = vsubss_avx512f(auVar28,auVar17);
  (in_RDI->w).z = auVar10._0_4_;
  auVar10 = vsubss_avx512f(auVar18,auVar21);
  (in_RDI->w).w = auVar10._0_4_;
  lVar9 = 0;
  do {
    (&(in_RDI->x).x)[lVar9] = (1.0 / auVar16._0_4_) * (&(in_RDI->x).x)[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  return in_RDI;
}

Assistant:

float4x4 Inverse(const float4x4 &m)
{
	float4x4 d;
	float *dst = &d.x.x;
	float tmp[12]; /* temp array for pairs */
	float src[16]; /* array of transpose source matrix */
	float det; /* determinant */
	/* transpose matrix */
	for ( int i = 0; i < 4; i++) {
		src[i] = m(i,0) ;
		src[i + 4] = m(i,1);
		src[i + 8] = m(i,2);
		src[i + 12] = m(i,3); 
	}
	/* calculate pairs for first 8 elements (cofactors) */
	tmp[0]  = src[10] * src[15];
	tmp[1]  = src[11] * src[14];
	tmp[2]  = src[9] * src[15];
	tmp[3]  = src[11] * src[13];
	tmp[4]  = src[9] * src[14];
	tmp[5]  = src[10] * src[13];
	tmp[6]  = src[8] * src[15];
	tmp[7]  = src[11] * src[12];
	tmp[8]  = src[8] * src[14];
	tmp[9]  = src[10] * src[12];
	tmp[10] = src[8] * src[13];
	tmp[11] = src[9] * src[12];
	/* calculate first 8 elements (cofactors) */
	dst[0]  = tmp[0]*src[5] + tmp[3]*src[6] + tmp[4]*src[7];
	dst[0] -= tmp[1]*src[5] + tmp[2]*src[6] + tmp[5]*src[7];
	dst[1]  = tmp[1]*src[4] + tmp[6]*src[6] + tmp[9]*src[7];
	dst[1] -= tmp[0]*src[4] + tmp[7]*src[6] + tmp[8]*src[7];
	dst[2]  = tmp[2]*src[4] + tmp[7]*src[5] + tmp[10]*src[7];
	dst[2] -= tmp[3]*src[4] + tmp[6]*src[5] + tmp[11]*src[7];
	dst[3]  = tmp[5]*src[4] + tmp[8]*src[5] + tmp[11]*src[6];
	dst[3] -= tmp[4]*src[4] + tmp[9]*src[5] + tmp[10]*src[6];
	dst[4]  = tmp[1]*src[1] + tmp[2]*src[2] + tmp[5]*src[3];
	dst[4] -= tmp[0]*src[1] + tmp[3]*src[2] + tmp[4]*src[3];
	dst[5]  = tmp[0]*src[0] + tmp[7]*src[2] + tmp[8]*src[3];
	dst[5] -= tmp[1]*src[0] + tmp[6]*src[2] + tmp[9]*src[3];
	dst[6]  = tmp[3]*src[0] + tmp[6]*src[1] + tmp[11]*src[3];
	dst[6] -= tmp[2]*src[0] + tmp[7]*src[1] + tmp[10]*src[3];
	dst[7]  = tmp[4]*src[0] + tmp[9]*src[1] + tmp[10]*src[2];
	dst[7] -= tmp[5]*src[0] + tmp[8]*src[1] + tmp[11]*src[2];
	/* calculate pairs for second 8 elements (cofactors) */
	tmp[0]  = src[2]*src[7];
	tmp[1]  = src[3]*src[6];
	tmp[2]  = src[1]*src[7];
	tmp[3]  = src[3]*src[5];
	tmp[4]  = src[1]*src[6];
	tmp[5]  = src[2]*src[5];
	tmp[6]  = src[0]*src[7];
	tmp[7]  = src[3]*src[4];
	tmp[8]  = src[0]*src[6];
	tmp[9]  = src[2]*src[4];
	tmp[10] = src[0]*src[5];
	tmp[11] = src[1]*src[4];
	/* calculate second 8 elements (cofactors) */
	dst[8]  = tmp[0]*src[13] + tmp[3]*src[14] + tmp[4]*src[15];
	dst[8] -= tmp[1]*src[13] + tmp[2]*src[14] + tmp[5]*src[15];
	dst[9]  = tmp[1]*src[12] + tmp[6]*src[14] + tmp[9]*src[15];
	dst[9] -= tmp[0]*src[12] + tmp[7]*src[14] + tmp[8]*src[15];
	dst[10] = tmp[2]*src[12] + tmp[7]*src[13] + tmp[10]*src[15];
	dst[10]-= tmp[3]*src[12] + tmp[6]*src[13] + tmp[11]*src[15];
	dst[11] = tmp[5]*src[12] + tmp[8]*src[13] + tmp[11]*src[14];
	dst[11]-= tmp[4]*src[12] + tmp[9]*src[13] + tmp[10]*src[14];
	dst[12] = tmp[2]*src[10] + tmp[5]*src[11] + tmp[1]*src[9];
	dst[12]-= tmp[4]*src[11] + tmp[0]*src[9] + tmp[3]*src[10];
	dst[13] = tmp[8]*src[11] + tmp[0]*src[8] + tmp[7]*src[10];
	dst[13]-= tmp[6]*src[10] + tmp[9]*src[11] + tmp[1]*src[8];
	dst[14] = tmp[6]*src[9] + tmp[11]*src[11] + tmp[3]*src[8];
	dst[14]-= tmp[10]*src[11] + tmp[2]*src[8] + tmp[7]*src[9];
	dst[15] = tmp[10]*src[10] + tmp[4]*src[8] + tmp[9]*src[9];
	dst[15]-= tmp[8]*src[9] + tmp[11]*src[10] + tmp[5]*src[8];
	/* calculate determinant */
	det=src[0]*dst[0]+src[1]*dst[1]+src[2]*dst[2]+src[3]*dst[3];
	/* calculate matrix inverse */
	det = 1/det;
	for ( int j = 0; j < 16; j++)
	dst[j] *= det;
	return d;
}